

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O0

shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram> __thiscall
polyscope::render::backend_openGL3_glfw::GLEngine::getCompiledProgram
          (GLEngine *this,string *programName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *customRules,ShaderReplacementDefaults defaults)

{
  bool bVar1;
  const_iterator cVar2;
  mapped_type *this_00;
  value_type *__x;
  reference pbVar3;
  long lVar4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  iterator stages_00;
  vector<polyscope::render::ShaderReplacementRule,_std::allocator<polyscope::render::ShaderReplacementRule>_>
  *this_01;
  mapped_type *this_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  element_type *in_RDI;
  uint in_R8D;
  shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram> sVar6;
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  updatedStages;
  ShaderReplacementRule *thisRule;
  string *ruleName;
  iterator it;
  vector<polyscope::render::ShaderReplacementRule,_std::allocator<polyscope::render::ShaderReplacementRule>_>
  rules;
  string *rule;
  iterator __end5;
  iterator __begin5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fullCustomRules;
  DrawMode dm;
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  *stages;
  string progKey;
  vector<polyscope::render::ShaderReplacementRule,_std::allocator<polyscope::render::ShaderReplacementRule>_>
  *in_stack_00000550;
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  *in_stack_00000558;
  GLCompiledProgram *in_stack_fffffffffffffc98;
  string *in_stack_fffffffffffffca0;
  value_type *in_stack_fffffffffffffca8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffcb0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffcb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce0;
  iterator in_stack_fffffffffffffce8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffcf0;
  const_iterator in_stack_fffffffffffffcf8;
  iterator in_stack_fffffffffffffd00;
  string local_248 [32];
  string local_228 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>,_true>
  local_208;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>,_true>
  local_200;
  GLCompiledProgram *local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e8;
  reference in_stack_fffffffffffffe20;
  DrawMode dm_00;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_138;
  long local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined8 in_stack_ffffffffffffff20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff30;
  GLEngine *in_stack_ffffffffffffff38;
  string local_b8 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_true>
  local_98;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_true>
  local_90;
  string local_88 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram>_>,_true>
  local_68 [3];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram>_>,_true>
  local_50;
  string local_48 [36];
  uint local_24;
  
  local_24 = in_R8D;
  programKeyFromRules(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                      (ShaderReplacementDefaults)((ulong)in_stack_ffffffffffffff20 >> 0x20));
  local_50._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram>_>_>_>
       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram>_>_>_>
               *)in_stack_fffffffffffffc98,(key_type *)0x4fb69b);
  local_68[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram>_>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram>_>_>_>
              *)in_stack_fffffffffffffc98);
  bVar1 = std::__detail::operator==(&local_50,local_68);
  if (bVar1) {
    if (3 < options::verbosity) {
      std::operator+((char *)in_stack_fffffffffffffce8._M_current,in_stack_fffffffffffffce0);
      polyscope::info(in_stack_fffffffffffffca0);
      std::__cxx11::string::~string(local_88);
    }
    local_90._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
         ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
                 *)in_stack_fffffffffffffc98,(key_type *)0x4fb792);
    local_98._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
         ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
                *)in_stack_fffffffffffffc98);
    bVar1 = std::__detail::operator==(&local_90,&local_98);
    if (bVar1) {
      std::operator+((char *)in_stack_fffffffffffffce8._M_current,in_stack_fffffffffffffce0);
      std::operator+(&in_stack_fffffffffffffca8->ruleName,(char *)in_stack_fffffffffffffca0);
      exception(in_stack_fffffffffffffd00._M_current);
      std::__cxx11::string::~string(local_b8);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff28);
    }
    cVar2._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
         ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
                       *)in_stack_fffffffffffffca0,(key_type *)in_stack_fffffffffffffc98);
    this_00 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
              ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>_>
                            *)in_stack_fffffffffffffca0,(key_type *)in_stack_fffffffffffffc98);
    local_100.field_2._12_4_ = this_00->second;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffcf0._M_current,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffce8._M_current);
    __x = (value_type *)(ulong)local_24;
    switch(__x) {
    case (value_type *)0x0:
      local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffc98);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffffca0,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffffc98);
      local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffffc98);
      local_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffc98);
      local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcf8,
                             in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8._M_current);
      break;
    case (value_type *)0x1:
      local_130 = in_RSI + 0x298;
      local_138._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffc98);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffc98);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffca0,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffc98), bVar1) {
        pbVar3 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_138);
        lVar4 = std::__cxx11::string::rfind((char *)pbVar3,0x8120bf);
        if (lVar4 != 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffc98);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          ::__normal_iterator<std::__cxx11::string*>
                    ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffffca0,
                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffffc98);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)this_00,cVar2,__x);
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_138);
      }
      break;
    case (value_type *)0x2:
      cVar2._M_current = &local_100;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffc98);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffffca0,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffffc98);
      _Var5._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x2b0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffc98);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffc98);
      in_stack_fffffffffffffd00 =
           std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
           insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                     (in_stack_fffffffffffffce0,cVar2,_Var5,in_stack_fffffffffffffce8._M_current);
      break;
    case (value_type *)0x3:
      in_stack_fffffffffffffce0 = &local_100;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffc98);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffffca0,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffffc98);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffc98);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffc98);
      in_stack_fffffffffffffce8 =
           std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
           insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                     (in_stack_fffffffffffffce0,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                      in_stack_fffffffffffffce8._M_current);
      break;
    case (value_type *)0x4:
    }
    std::
    vector<polyscope::render::ShaderReplacementRule,_std::allocator<polyscope::render::ShaderReplacementRule>_>
    ::vector((vector<polyscope::render::ShaderReplacementRule,_std::allocator<polyscope::render::ShaderReplacementRule>_>
              *)0x4fbc73);
    _Var5._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffc98);
    while( true ) {
      dm_00 = (DrawMode)((ulong)in_stack_fffffffffffffe20 >> 0x20);
      stages_00 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffc98);
      bVar1 = __gnu_cxx::operator<
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffca0,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffc98);
      if (!bVar1) break;
      in_stack_fffffffffffffe20 =
           __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&stack0xfffffffffffffe30);
      bVar1 = std::operator==(in_stack_fffffffffffffca0,(char *)in_stack_fffffffffffffc98);
      if (!bVar1) {
        local_1f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_fffffffffffffc98);
        local_1f8 = (GLCompiledProgram *)_Var5._M_current;
        _Var5._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8;
        local_1e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                              (in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                               &in_stack_fffffffffffffca8->ruleName);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffffca0,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffffc98);
        if (!bVar1) {
          local_200._M_cur =
               (__node_type *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
               ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
                       *)in_stack_fffffffffffffc98,(key_type *)0x4fbda4);
          local_208._M_cur =
               (__node_type *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
               ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
                      *)in_stack_fffffffffffffc98);
          bVar1 = std::__detail::operator==(&local_200,&local_208);
          if (bVar1) {
            std::operator+((char *)in_stack_fffffffffffffce8._M_current,in_stack_fffffffffffffce0);
            std::operator+(&in_stack_fffffffffffffca8->ruleName,(char *)in_stack_fffffffffffffca0);
            exception(in_stack_fffffffffffffd00._M_current);
            std::__cxx11::string::~string(local_228);
            std::__cxx11::string::~string(local_248);
          }
          in_stack_fffffffffffffcb8._M_current =
               &std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
                ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
                              *)in_stack_fffffffffffffca0,(key_type *)in_stack_fffffffffffffc98)->
                ruleName;
          std::
          vector<polyscope::render::ShaderReplacementRule,_std::allocator<polyscope::render::ShaderReplacementRule>_>
          ::push_back((vector<polyscope::render::ShaderReplacementRule,_std::allocator<polyscope::render::ShaderReplacementRule>_>
                       *)in_stack_fffffffffffffcb0._M_current,in_stack_fffffffffffffca8);
        }
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffffca8,(int)((ulong)in_stack_fffffffffffffca0 >> 0x20));
    }
    applyShaderReplacements(in_stack_00000558,in_stack_00000550);
    this_01 = (vector<polyscope::render::ShaderReplacementRule,_std::allocator<polyscope::render::ShaderReplacementRule>_>
               *)operator_new(0x50);
    GLCompiledProgram::GLCompiledProgram
              ((GLCompiledProgram *)_Var5._M_current,
               (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                *)stages_00._M_current,dm_00);
    std::shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram>::
    shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram,void>
              ((shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram> *)
               in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram>_>_>_>
    ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram>_>_>_>
                  *)in_stack_fffffffffffffca0,(key_type *)in_stack_fffffffffffffc98);
    std::shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram>::operator=
              ((shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram> *)
               in_stack_fffffffffffffca0,
               (shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram> *)
               in_stack_fffffffffffffc98);
    std::shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram>::~shared_ptr
              ((shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram> *)0x4fbfa8);
    std::
    vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
    ::~vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
               *)this_01);
    std::
    vector<polyscope::render::ShaderReplacementRule,_std::allocator<polyscope::render::ShaderReplacementRule>_>
    ::~vector(this_01);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_01);
  }
  this_02 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram>_>_>_>
            ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram>_>_>_>
                          *)in_stack_fffffffffffffca0,(key_type *)in_stack_fffffffffffffc98);
  std::shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram>::shared_ptr
            (this_02,(shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram> *)
                     in_stack_fffffffffffffc98);
  std::__cxx11::string::~string(local_48);
  sVar6.
  super___shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar6.
  super___shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = in_RDI;
  return (shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram>)
         sVar6.
         super___shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<GLCompiledProgram> GLEngine::getCompiledProgram(const std::string& programName,
                                                                const std::vector<std::string>& customRules,
                                                                ShaderReplacementDefaults defaults) {

  // Build a cache key for the program
  std::string progKey = programKeyFromRules(programName, customRules, defaults);


  // If the cache doesn't already contain the program, create it and add to cache
  if (compiledProgamCache.find(progKey) == compiledProgamCache.end()) {

    if (polyscope::options::verbosity > 3) polyscope::info("compiling shader program " + progKey);

    // == Compile the program

    // Get the list of shaders comprising the program from the global cache
    if (registeredShaderPrograms.find(programName) == registeredShaderPrograms.end()) {
      exception("No shader program with name [" + programName + "] registered.");
    }
    const std::vector<ShaderStageSpecification>& stages = registeredShaderPrograms[programName].first;
    DrawMode dm = registeredShaderPrograms[programName].second;

    // Add in the default rules
    std::vector<std::string> fullCustomRules = customRules;
    switch (defaults) {
    case ShaderReplacementDefaults::SceneObject: {
      fullCustomRules.insert(fullCustomRules.end(), defaultRules_sceneObject.begin(), defaultRules_sceneObject.end());
      break;
    }
    case ShaderReplacementDefaults::SceneObjectNoSlice: {
      for (const std::string& rule : defaultRules_sceneObject) {
        if (rule.rfind("SLICE_PLANE_", 0) != 0) {
          fullCustomRules.insert(fullCustomRules.end(), rule);
        }
      }
      break;
    }
    case ShaderReplacementDefaults::Pick: {
      fullCustomRules.insert(fullCustomRules.end(), defaultRules_pick.begin(), defaultRules_pick.end());
      break;
    }
    case ShaderReplacementDefaults::Process: {
      fullCustomRules.insert(fullCustomRules.end(), defaultRules_process.begin(), defaultRules_process.end());
      break;
    }
    case ShaderReplacementDefaults::None: {
      break;
    }
    }

    // Prepare rule substitutions
    std::vector<ShaderReplacementRule> rules;
    for (auto it = fullCustomRules.begin(); it < fullCustomRules.end(); it++) {
      std::string& ruleName = *it;

      // Empty rule is a no-op
      if (ruleName == "") {
        continue;
      }

      // Only process each rule the first time it is seen
      if (std::find(fullCustomRules.begin(), it, ruleName) != it) {
        continue;
      }

      if (registeredShaderRules.find(ruleName) == registeredShaderRules.end()) {
        exception("No shader replacement rule with name [" + ruleName + "] registered.");
      }
      ShaderReplacementRule& thisRule = registeredShaderRules[ruleName];
      rules.push_back(thisRule);
    }

    // Actually apply rule substitutions
    std::vector<ShaderStageSpecification> updatedStages = applyShaderReplacements(stages, rules);

    // Create a new compiled program (GL work happens in the constructor)
    compiledProgamCache[progKey] = std::shared_ptr<GLCompiledProgram>(new GLCompiledProgram(updatedStages, dm));
  }

  // Now that the cache must contain the compiled program, just return it
  return compiledProgamCache[progKey];
}